

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.cpp
# Opt level: O2

void CovarianceTexture(int x,int y)

{
  Covariance4D<Vector,_double> *cov;
  double dVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ostream *poVar10;
  int iVar11;
  long lVar12;
  double *pdVar13;
  Cov4D *pCVar14;
  int iVar15;
  int x_1;
  int iVar16;
  byte bVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double sxy;
  Vector local_268;
  Vector local_248;
  double local_230;
  double syy;
  double sxx;
  Ray ray;
  double t_1;
  int id;
  Vector v_1;
  Vector t;
  PosCov surfCov;
  Cov4D pixelCov;
  
  bVar17 = 0;
  dVar23 = ((double)x + 0.5) / (double)width + -0.5;
  dVar21 = ((double)y + 0.5) / (double)height + -0.5;
  dVar19 = cam.d.y + dVar21 * cy.y + dVar23 * cx.y;
  surfCov.first.y._0_4_ = SUB84(dVar19,0);
  surfCov.first.x = cam.d.x + dVar21 * cy.x + dVar23 * cx.x;
  surfCov.first.y._4_4_ = (int)((ulong)dVar19 >> 0x20);
  surfCov.first.z = cy.z * dVar21 + cx.z * dVar23 + cam.d.z;
  Vector::Normalize(&t,&surfCov.first);
  pdVar13 = (double *)&DAT_0011e668;
  pCVar14 = &pixelCov;
  for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pCVar14->matrix)._M_elems[0] = *pdVar13;
    pdVar13 = pdVar13 + (ulong)bVar17 * -2 + 1;
    pCVar14 = (Cov4D *)((long)pCVar14 + (ulong)bVar17 * -0x10 + 8);
  }
  pixelCov.y.y = 0.0;
  pixelCov.y.z = 0.0;
  pixelCov.x.z = 0.0;
  pixelCov.y.x = 0.0;
  pixelCov.x.x = 0.0;
  pixelCov.x.y = 0.0;
  pixelCov.z.x = t.x;
  pixelCov.z.y = t.y;
  pixelCov.z.z = t.z;
  Vector::Frame(&t,&pixelCov.x,&pixelCov.y);
  std::__cxx11::string::string<std::allocator<char>>((string *)&surfCov,"",(allocator<char> *)&ray);
  std::__cxx11::stringbuf::str((string *)(sout_abi_cxx11_ + 0x18));
  std::__cxx11::string::~string((string *)&surfCov);
  ray.o.z = cam.o.z;
  ray.o.x = cam.o.x;
  ray.o.y = cam.o.y;
  ray.d.x = t.x;
  ray.d.y = t.y;
  ray.d.z = t.z;
  CovarianceFilter(&surfCov,&spheres,&ray,&pixelCov,0,1,(stringstream *)sout_abi_cxx11_);
  cov = &surfCov.second;
  operator<<((ostream *)(sout_abi_cxx11_ + 0x10),cov);
  std::endl<char,std::char_traits<char>>((ostream *)(sout_abi_cxx11_ + 0x10));
  std::operator<<((ostream *)(sout_abi_cxx11_ + 0x10),"Volume = ");
  dVar23 = Covariance::Covariance4D<Vector,_double>::Volume(cov);
  poVar10 = std::ostream::_M_insert<double>(dVar23);
  std::endl<char,std::char_traits<char>>(poVar10);
  std::endl<char,std::char_traits<char>>((ostream *)(sout_abi_cxx11_ + 0x10));
  sxx = 0.0;
  syy = 0.0;
  sxy = 0.0;
  local_248.x = 0.0;
  local_248.y = 0.0;
  local_248.z = 0.0;
  local_268.x = 0.0;
  local_268.y = 0.0;
  local_268.z = 0.0;
  Covariance::Covariance4D<Vector,_double>::SpatialFilter(cov,&sxx,&sxy,&syy);
  Covariance::Covariance4D<Vector,_double>::SpatialExtent(cov,&local_248,&local_268);
  std::operator<<((ostream *)(sout_abi_cxx11_ + 0x10),"Spatial filter = [");
  poVar10 = std::ostream::_M_insert<double>(sxx);
  std::operator<<(poVar10,",");
  poVar10 = std::ostream::_M_insert<double>(sxy);
  std::operator<<(poVar10,"; ");
  poVar10 = std::ostream::_M_insert<double>(sxy);
  std::operator<<(poVar10,", ");
  poVar10 = std::ostream::_M_insert<double>(syy);
  poVar10 = std::operator<<(poVar10,"]");
  std::endl<char,std::char_traits<char>>(poVar10);
  poVar10 = std::operator<<((ostream *)(sout_abi_cxx11_ + 0x10),"Extent = ");
  poVar10 = operator<<(poVar10,&local_248);
  poVar10 = std::operator<<(poVar10,", ");
  poVar10 = operator<<(poVar10,&local_268);
  std::endl<char,std::char_traits<char>>(poVar10);
  std::operator<<((ostream *)(sout_abi_cxx11_ + 0x10),"|Dx| = ");
  dVar23 = Vector::Norm(&local_248);
  poVar10 = std::ostream::_M_insert<double>(dVar23);
  std::operator<<(poVar10,", |Dy| = ");
  dVar23 = Vector::Norm(&local_268);
  poVar10 = std::ostream::_M_insert<double>(dVar23);
  std::endl<char,std::char_traits<char>>(poVar10);
  iVar9 = 0;
  do {
    if (height <= iVar9) {
      return;
    }
    iVar15 = -1;
    for (iVar16 = 0; iVar3 = height, iVar2 = width, iVar16 < width; iVar16 = iVar16 + 1) {
      dVar23 = ((double)iVar16 + 0.5) / (double)width + -0.5;
      dVar21 = ((double)iVar9 + 0.5) / (double)height + -0.5;
      dVar19 = cam.d.y + dVar21 * cy.y + dVar23 * cx.y;
      v_1.y._0_4_ = SUB84(dVar19,0);
      v_1.x = cam.d.x + dVar21 * cy.x + dVar23 * cx.x;
      v_1.y._4_4_ = (int)((ulong)dVar19 >> 0x20);
      v_1.z = cy.z * dVar21 + cx.z * dVar23 + cam.d.z;
      Vector::Normalize(&ray.o,&v_1);
      ray.o.z = cam.o.z;
      ray.o.x = cam.o.x;
      ray.o.y = cam.o.y;
      ray.d.z = v_1.z;
      ray.d.x = v_1.x;
      ray.d.y = v_1.y;
      bVar7 = Intersect(&spheres,&ray,&t_1,&id);
      if (bVar7) {
        dVar23 = surfCov.first.x - (ray.d.x * t_1 + ray.o.x);
        dVar19 = surfCov.first.y - (ray.d.y * t_1 + ray.o.y);
        dVar22 = surfCov.first.z - (t_1 * ray.d.z + ray.o.z);
        dVar24 = surfCov.second.x.z * dVar22 +
                 surfCov.second.x.x * dVar23 + surfCov.second.x.y * dVar19;
        dVar21 = surfCov.second.y.z * dVar22 +
                 surfCov.second.y.x * dVar23 + surfCov.second.y.y * dVar19;
        dVar23 = dVar22 * surfCov.second.z.z +
                 dVar23 * surfCov.second.z.x + dVar19 * surfCov.second.z.y;
        if (useCovFilter == true) {
          dVar22 = dVar21 * dVar21 * syy;
          dVar19 = dVar24 * dVar24 * sxx;
          dVar24 = (dVar24 + dVar24) * dVar21 * sxy;
          dVar21 = exp(dVar23 * -10.0 * dVar23);
          dVar23 = exp((dVar24 + dVar19 + dVar22) * -0.5);
          dVar23 = dVar23 * dVar21;
LAB_0011802a:
          fVar18 = (float)dVar23;
        }
        else {
          dVar19 = local_248.y * dVar21;
          dVar20 = local_248.x * dVar24;
          dVar22 = local_248.z * dVar23;
          local_230 = dVar23;
          dVar23 = Vector::Norm(&local_248);
          dVar6 = local_268.z;
          dVar5 = local_268.y;
          dVar4 = local_268.x;
          dVar1 = Vector::Norm(&local_268);
          iVar8 = (int)((dVar22 + dVar20 + dVar19) / dVar23);
          iVar11 = -iVar8;
          if (0 < iVar8) {
            iVar11 = iVar8;
          }
          dVar23 = Vector::Norm(&local_248);
          fVar18 = 0.0;
          if ((double)iVar11 < dVar23) {
            iVar8 = (int)((dVar6 * local_230 + dVar24 * dVar4 + dVar21 * dVar5) / dVar1);
            iVar11 = -iVar8;
            if (0 < iVar8) {
              iVar11 = iVar8;
            }
            dVar23 = Vector::Norm(&local_268);
            fVar18 = 0.0;
            if ((double)iVar11 < dVar23) {
              dVar23 = exp(local_230 * -10.0 * local_230);
              goto LAB_0011802a;
            }
          }
        }
        cov_img[iVar3 * (iVar2 + iVar15) + iVar9] = fVar18;
      }
      iVar15 = iVar15 + -1;
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void CovarianceTexture(int x, int y) {
   // Generate a covariance matrix at the sampling position
   const auto t = (cx*((x+0.5)/double(width) - .5) + cy*((y+0.5)/double(height) - .5) + cam.d).Normalize();
   //*/
   const auto pixelCov = Cov4D({ 1.0E+5, 0.0, 1.0E+5, 0.0, 0.0, 1.0E+5, 0.0, 0.0, 0.0, 1.0E+5 }, t);
   /*/
   const auto pixelCov = Cov4D({ 1.0E-5, 0.0, 1.0E-5, 0.0, 0.0, 1.0E-5, 0.0, 0.0, 0.0, 1.0E-5 }, t);
   //*/
   sout.str("");
   const auto surfCov  = CovarianceFilter(spheres, Ray(cam.o, t), pixelCov, 0, 1, sout);
   sout << surfCov.second << std::endl;
   sout << "Volume = " << surfCov.second.Volume() << std::endl;
   sout << std::endl;

   double sxx = 0, syy = 0, sxy = 0;
   Vector Dx, Dy;
   try {
      surfCov.second.SpatialFilter(sxx, sxy, syy);
      surfCov.second.SpatialExtent(Dx, Dy);
      sout << "Spatial filter = [" << sxx << "," << sxy << "; " << sxy << ", " << syy << "]"<< std::endl;
      sout << "Extent = " << Dx << ", " << Dy << std::endl;
      sout << "|Dx| = " << Vector::Norm(Dx) << ", |Dy| = " << Vector::Norm(Dy) << std::endl;
   } catch (...) {
      std::cout << "Error: incorrect spatial filter" << std::endl;
      sout << surfCov.second << std::endl;
      return;
   }

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   #pragma omp parallel for schedule(dynamic, 1)
   for (int y=0; y<height; y++){
      for (int x=0; x<width; x++) {
         // Pixel index
         int i=(width-x-1)*height+y;

         // Generate the pixel direction
         Vector d = cx*( ( 0.5 + x)/width - .5) +
                    cy*( ( 0.5 + y)/height - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         double t; int id;
         if(!Intersect(spheres, ray, t, id)){ continue; }
         Vector hitp = ray.o + t*ray.d;

         // Evaluate the covariance
         const Vector dx  = surfCov.first - hitp;
         const Vector dU = Vector(Vector::Dot(dx, surfCov.second.x), Vector::Dot(dx, surfCov.second.y), Vector::Dot(dx, surfCov.second.z));
         if(useCovFilter) {
            double bf = dU.x*dU.x*sxx + dU.y*dU.y*syy + 2*dU.x*dU.y*sxy;
            cov_img[i] = exp(-10.0*dU.z*dU.z) * exp(- 0.5* bf);
         } else {

            const double du  = Vector::Dot(dU, Dx) / Vector::Norm(Dx);
            const double dv  = Vector::Dot(dU, Dy) / Vector::Norm(Dy);
            cov_img[i] = (abs(du) < Vector::Norm(Dx) &&
                          abs(dv) < Vector::Norm(Dy)) ? exp(-10.0*dU.z*dU.z) : 0.0;
         }
      }
   }
}